

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

uint32_t fs_ask(aec_stream_conflict *strm)

{
  byte *pbVar1;
  uint32_t uVar2;
  aec_stream_conflict *in_RDI;
  uint32_t local_4;
  
  uVar2 = bits_ask(in_RDI,1);
  if (uVar2 == 0) {
    local_4 = 0;
  }
  else {
    while ((in_RDI->state->acc & 1L << ((char)in_RDI->state->bitp - 1U & 0x3f)) == 0) {
      if (in_RDI->state->bitp == 1) {
        if (in_RDI->avail_in == 0) {
          return 0;
        }
        in_RDI->avail_in = in_RDI->avail_in - 1;
        in_RDI->state->acc = in_RDI->state->acc << 8;
        pbVar1 = in_RDI->next_in;
        in_RDI->next_in = pbVar1 + 1;
        in_RDI->state->acc = (ulong)*pbVar1 | in_RDI->state->acc;
        in_RDI->state->bitp = in_RDI->state->bitp + 8;
      }
      in_RDI->state->fs = in_RDI->state->fs + 1;
      in_RDI->state->bitp = in_RDI->state->bitp + -1;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline uint32_t fs_ask(struct aec_stream *strm)
{
    if (bits_ask(strm, 1) == 0)
        return 0;
    while ((strm->state->acc & (UINT64_C(1) << (strm->state->bitp - 1))) == 0) {
        if (strm->state->bitp == 1) {
            if (strm->avail_in == 0)
                return 0;
            strm->avail_in--;
            strm->state->acc <<= 8;
            strm->state->acc |= *strm->next_in++;
            strm->state->bitp += 8;
        }
        strm->state->fs++;
        strm->state->bitp--;
    }
    return 1;
}